

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O0

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  cmState *pcVar2;
  bool bVar3;
  size_type sVar4;
  const_reference name;
  const_reference name_00;
  ulong uVar5;
  const_reference pvVar6;
  char *pcVar7;
  bool local_1e2;
  bool local_1e1;
  bool local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  undefined1 local_128 [8];
  string message;
  string local_100;
  char *local_e0;
  char *reqVar;
  string local_d0;
  uint local_ac;
  cmState *pcStack_a8;
  uint i;
  cmState *state;
  string local_98 [7];
  bool hasAdvanced;
  string notSet;
  bool requirementsMet;
  string *resultVariable;
  string *testVariable;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmVariableRequiresCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
    bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,name);
    if (bVar3) {
      name_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,1);
      notSet.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::string(local_98);
      state._7_1_ = 0;
      pcStack_a8 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      for (local_ac = 2; uVar5 = (ulong)local_ac,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local), uVar5 < sVar4; local_ac = local_ac + 1) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_ac);
        bVar3 = cmMakefile::IsOn(pcVar1,pvVar6);
        if (!bVar3) {
          notSet.field_2._M_local_buf[0xf] = '\0';
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_ac);
          std::__cxx11::string::operator+=(local_98,(string *)pvVar6);
          std::__cxx11::string::operator+=(local_98,"\n");
          pcVar2 = pcStack_a8;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_ac);
          reqVar._6_1_ = 0;
          reqVar._5_1_ = 0;
          pcVar7 = cmState::GetCacheEntryValue(pcVar2,pvVar6);
          pcVar2 = pcStack_a8;
          local_1b1 = false;
          if (pcVar7 != (char *)0x0) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_ac);
            std::allocator<char>::allocator();
            reqVar._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"ADVANCED",(allocator<char> *)((long)&reqVar + 7));
            reqVar._5_1_ = 1;
            local_1b1 = cmState::GetCacheEntryPropertyAsBool(pcVar2,pvVar6,&local_d0);
          }
          if ((reqVar._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_d0);
          }
          if ((reqVar._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&reqVar + 7));
          }
          if (local_1b1 != false) {
            state._7_1_ = 1;
          }
        }
      }
      pcVar7 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name_00);
      message.field_2._M_local_buf[0xe] = '\0';
      message.field_2._M_local_buf[0xd] = '\0';
      local_1e1 = true;
      local_e0 = pcVar7;
      if (pcVar7 != (char *)0x0) {
        local_1e2 = false;
        if ((notSet.field_2._M_local_buf[0xf] & 1U) == 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          message.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,pcVar7,
                     (allocator<char> *)(message.field_2._M_local_buf + 0xf));
          message.field_2._M_local_buf[0xd] = '\x01';
          local_1e2 = cmMakefile::IsOn(pcVar1,&local_100);
        }
        local_1e1 = local_1e2;
      }
      if ((message.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_100);
      }
      if ((message.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
      }
      if (local_1e1 != false) {
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,name_00,
                   (bool)(notSet.field_2._M_local_buf[0xf] & 1));
      }
      if ((notSet.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_128,"Variable assertion failed:\n",&local_129);
        std::allocator<char>::~allocator(&local_129);
        std::operator+(&local_150,name," Requires that the following unset variables are set:\n");
        std::__cxx11::string::operator+=((string *)local_128,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::operator+=((string *)local_128,local_98);
        std::__cxx11::string::operator+=((string *)local_128,"\nPlease set them, or set ");
        std::operator+(&local_170,name," to false, and re-configure.\n");
        std::__cxx11::string::operator+=((string *)local_128,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        if ((state._7_1_ & 1) != 0) {
          std::__cxx11::string::operator+=
                    ((string *)local_128,
                     "One or more of the required variables is advanced.  To set the variable, you must turn on advanced mode in cmake."
                    );
        }
        cmSystemTools::Error((string *)local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string(local_98);
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmVariableRequiresCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& testVariable = args[0];
  if (!this->Makefile->IsOn(testVariable)) {
    return true;
  }
  std::string const& resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (!this->Makefile->IsOn(args[i])) {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if (state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED")) {
        hasAdvanced = true;
      }
    }
  }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if (!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar))) {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
  }

  if (!requirementsMet) {
    std::string message = "Variable assertion failed:\n";
    message +=
      testVariable + " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if (hasAdvanced) {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
    }
    cmSystemTools::Error(message);
  }

  return true;
}